

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UBool __thiscall icu_63::UnicodeSet::containsNone(UnicodeSet *this,UnicodeString *s)

{
  ushort uVar1;
  short sVar2;
  int32_t iVar3;
  int iVar4;
  char16_t *s_00;
  
  uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      s_00 = (s->fUnion).fFields.fArray;
    }
    else {
      s_00 = (s->fUnion).fStackFields.fBuffer;
    }
  }
  else {
    s_00 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    iVar3 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)(short)uVar1 >> 5;
  }
  iVar3 = span(this,s_00,iVar3,USET_SPAN_NOT_CONTAINED);
  sVar2 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar4 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar2 >> 5;
  }
  return iVar3 == iVar4;
}

Assistant:

UBool UnicodeSet::containsNone(const UnicodeString& s) const {
    return (UBool)(span(s.getBuffer(), s.length(), USET_SPAN_NOT_CONTAINED) ==
                   s.length());
}